

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget_Type.cxx
# Opt level: O3

void when_button_cb(Fl_Light_Button *i,void *v)

{
  char cVar1;
  int iVar2;
  Fl_Widget_Type *q;
  Fl_Type *pFVar3;
  bool bVar4;
  
  if ((char *)v == "LOAD") {
    iVar2 = (*(current_widget->super_Fl_Type)._vptr_Fl_Type[0x1e])();
    if (iVar2 == 0) {
      Fl_Widget::activate((Fl_Widget *)i);
      Fl_Button::value(&i->super_Fl_Button,current_widget->o->when_ & 2);
      return;
    }
    Fl_Widget::deactivate((Fl_Widget *)i);
    return;
  }
  cVar1 = (i->super_Fl_Button).value_;
  if (Fl_Type::first != (Fl_Type *)0x0) {
    bVar4 = true;
    pFVar3 = Fl_Type::first;
    do {
      while ((pFVar3->selected != '\0' &&
             (iVar2 = (*pFVar3->_vptr_Fl_Type[0x17])(pFVar3), iVar2 != 0))) {
        *(byte *)((long)&(pFVar3[1].prev)->header_position + 3) =
             *(byte *)((long)&(pFVar3[1].prev)->header_position + 3) & 0xfd |
             (cVar1 != '\0') * '\x02';
        pFVar3 = pFVar3->next;
        bVar4 = false;
        if (pFVar3 == (Fl_Type *)0x0) goto LAB_0018466b;
      }
      pFVar3 = pFVar3->next;
    } while (pFVar3 != (Fl_Type *)0x0);
    if (!bVar4) {
LAB_0018466b:
      set_modflag(1);
      return;
    }
  }
  return;
}

Assistant:

void when_button_cb(Fl_Light_Button* i, void *v) {
  if (v == LOAD) {
    if (current_widget->is_menu_item()) {i->deactivate(); return;} else i->activate();
    i->value(current_widget->o->when()&FL_WHEN_NOT_CHANGED);
  } else {
    int mod = 0;
    int n = i->value() ? FL_WHEN_NOT_CHANGED : 0;
    for (Fl_Type *o = Fl_Type::first; o; o = o->next) {
      if (o->selected && o->is_widget()) {
	Fl_Widget_Type* q = (Fl_Widget_Type*)o;
	q->o->when(n|(q->o->when()&~FL_WHEN_NOT_CHANGED));
	mod = 1;
      }
    }
    if (mod) set_modflag(1);
  }
}